

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::MacOSXContentGeneratorType::operator()
          (MacOSXContentGeneratorType *this,cmSourceFile *source,char *pkgloc)

{
  bool bVar1;
  string *psVar2;
  cmGlobalNinjaGenerator *pcVar3;
  string output;
  string input;
  string macdir;
  string sStack_98;
  string local_78;
  string local_58;
  string local_38;
  
  bVar1 = cmGeneratorTarget::IsBundleOnApple
                    ((this->Generator->super_cmCommonTargetGenerator).GeneratorTarget);
  if (bVar1) {
    cmOSXBundleGenerator::InitMacOSXContentDirectory_abi_cxx11_
              (&local_38,this->Generator->OSXBundleGenerator,pkgloc);
    psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    std::__cxx11::string::string((string *)&local_78,(string *)psVar2);
    pcVar3 = GetGlobalGenerator(this->Generator);
    cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar3,&local_78);
    std::__cxx11::string::_M_assign((string *)&local_78);
    std::__cxx11::string::string((string *)&sStack_98,(string *)&local_38);
    std::__cxx11::string::append((char *)&sStack_98);
    cmsys::SystemTools::GetFilenameName(&local_58,&local_78);
    std::__cxx11::string::append((string *)&sStack_98);
    std::__cxx11::string::~string((string *)&local_58);
    pcVar3 = GetGlobalGenerator(this->Generator);
    cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar3,&sStack_98);
    std::__cxx11::string::_M_assign((string *)&sStack_98);
    pcVar3 = GetGlobalGenerator(this->Generator);
    cmGlobalNinjaGenerator::WriteMacOSXContentBuild(pcVar3,&local_78,&sStack_98);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->Generator->ExtraFiles,&sStack_98);
    std::__cxx11::string::~string((string *)&sStack_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::MacOSXContentGeneratorType::operator()(
  cmSourceFile const& source, const char* pkgloc)
{
  // Skip OS X content when not building a Framework or Bundle.
  if (!this->Generator->GetGeneratorTarget()->IsBundleOnApple()) {
    return;
  }

  std::string macdir =
    this->Generator->OSXBundleGenerator->InitMacOSXContentDirectory(pkgloc);

  // Get the input file location.
  std::string input = source.GetFullPath();
  input = this->Generator->GetGlobalGenerator()->ConvertToNinjaPath(input);

  // Get the output file location.
  std::string output = macdir;
  output += "/";
  output += cmSystemTools::GetFilenameName(input);
  output = this->Generator->GetGlobalGenerator()->ConvertToNinjaPath(output);

  // Write a build statement to copy the content into the bundle.
  this->Generator->GetGlobalGenerator()->WriteMacOSXContentBuild(input,
                                                                 output);

  // Add as a dependency to the target so that it gets called.
  this->Generator->ExtraFiles.push_back(std::move(output));
}